

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMulti.c
# Opt level: O3

Aig_Man_t * Gia_ManMultiProveSyn(Aig_Man_t *p,int fVerbose,int fVeryVerbose)

{
  Gia_Man_t *pInit;
  Gia_Man_t *p_00;
  Aig_Man_t *pAVar1;
  
  pInit = Gia_ManFromAig(p);
  p_00 = Gia_ManAigSyn2(pInit,1,0,0,0,0,0,0);
  Gia_ManStop(pInit);
  pAVar1 = Gia_ManToAig(p_00,0);
  Gia_ManStop(p_00);
  return pAVar1;
}

Assistant:

Aig_Man_t * Gia_ManMultiProveSyn( Aig_Man_t * p, int fVerbose, int fVeryVerbose )
{
    Aig_Man_t * pAig;
    Gia_Man_t * pGia, * pTemp;
    pGia = Gia_ManFromAig( p );
    pGia = Gia_ManAigSyn2( pTemp = pGia, 1, 0, 0, 0, 0, 0, 0 );
    Gia_ManStop( pTemp );
    pAig = Gia_ManToAig( pGia, 0 );
    Gia_ManStop( pGia );
    return pAig;
}